

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O1

void __thiscall
kj::_::Debug::logInternal
          (Debug *this,char *file,int line,LogSeverity severity,char *macroArgs,
          ArrayPtr<kj::String> argValues)

{
  ArrayPtr<kj::String> argValues_00;
  char *pcVar1;
  size_t sVar2;
  ExceptionCallback *pEVar3;
  size_t sVar4;
  size_t extraout_RDX;
  String *in_R9;
  String *sysErrorString;
  StringPtr SVar5;
  size_t in_stack_ffffffffffffff98;
  String local_58;
  char *local_40;
  
  sysErrorString = in_R9;
  pEVar3 = getExceptionCallback();
  sVar4 = strlen((char *)this);
  SVar5.content.size_ = extraout_RDX;
  SVar5.content.ptr = (char *)(sVar4 + 1);
  SVar5 = trimSourceFilename((kj *)this,SVar5);
  argValues_00.size_ = in_stack_ffffffffffffff98;
  argValues_00.ptr = in_R9;
  local_40 = macroArgs;
  anon_unknown_2::makeDescriptionImpl
            (&local_58,(anon_unknown_2 *)0x0,LOG,(char *)0x0,severity,(char *)sysErrorString,
             macroArgs,argValues_00);
  (*pEVar3->_vptr_ExceptionCallback[4])
            (pEVar3,(ulong)(uint)line,SVar5.content.ptr,(ulong)file & 0xffffffff,0,&local_58);
  sVar2 = local_58.content.size_;
  pcVar1 = local_58.content.ptr;
  if (local_58.content.ptr != (char *)0x0) {
    local_58.content.ptr = (char *)0x0;
    local_58.content.size_ = 0;
    (**(local_58.content.disposer)->_vptr_ArrayDisposer)
              (local_58.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

void Debug::logInternal(const char* file, int line, LogSeverity severity, const char* macroArgs,
                        ArrayPtr<String> argValues) {
  getExceptionCallback().logMessage(severity, trimSourceFilename(file).cStr(), line, 0,
      makeDescriptionImpl(LOG, nullptr, 0, nullptr, macroArgs, argValues));
}